

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strings.c
# Opt level: O0

void test_sbs_strcat(CuTest *tc)

{
  undefined1 local_30 [8];
  sbstring sbs;
  char buffer [8];
  CuTest *tc_local;
  
  sbs_init((sbstring *)local_30,(char *)&sbs.end,8);
  sbs_strcat((sbstring *)local_30,"AB");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x114,(char *)0x0,"AB",(char *)sbs.size);
  sbs_strcat((sbstring *)local_30,(char *)0x0);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x116,(char *)0x0,"AB",(char *)sbs.size);
  sbs_strcat((sbstring *)local_30,"CD");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x118,(char *)0x0,"ABCD",(char *)sbs.size);
  sbs_init((sbstring *)local_30,(char *)&sbs.end,8);
  sbs_strcat((sbstring *)local_30,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x11c,(char *)0x0,"1234567",(char *)sbs.size);
  sbs_strcat((sbstring *)local_30,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x11e,(char *)0x0,"1234567",(char *)sbs.size);
  sbs_init((sbstring *)local_30,(char *)&sbs.end,8);
  sbs_strncat((sbstring *)local_30,"12345678901234567890",4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x122,(char *)0x0,"1234",(char *)sbs.size);
  sbs_strncat((sbstring *)local_30,(char *)0x0,4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x124,(char *)0x0,"1234",(char *)sbs.size);
  sbs_strncat((sbstring *)local_30,"12345678901234567890",4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x126,(char *)0x0,"1234123",(char *)sbs.size);
  return;
}

Assistant:

static void test_sbs_strcat(CuTest * tc)
{
    char buffer[8];
    sbstring sbs;

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "AB");
    CuAssertStrEquals(tc, "AB", sbs.begin);
    sbs_strcat(&sbs, NULL);
    CuAssertStrEquals(tc, "AB", sbs.begin);
    sbs_strcat(&sbs, "CD");
    CuAssertStrEquals(tc, "ABCD", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "1234567", sbs.begin);
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "1234567", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strncat(&sbs, "12345678901234567890", 4);
    CuAssertStrEquals(tc, "1234", sbs.begin);
    sbs_strncat(&sbs, NULL, 4);
    CuAssertStrEquals(tc, "1234", sbs.begin);
    sbs_strncat(&sbs, "12345678901234567890", 4);
    CuAssertStrEquals(tc, "1234123", sbs.begin);
}